

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::genTexel
               (Random *rng,deUint32 glFormat,int texelBlockSize,int texelCount,deUint8 *buffer)

{
  bool bVar1;
  deUint8 dVar2;
  CompressedTexFormat format_00;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int local_15c;
  deUint8 val_1;
  int i_2;
  deUint8 val;
  int i_1;
  int blockNdx;
  int i;
  deUint8 blocks [8] [16];
  int BLOCK_SIZE;
  CompressedTexFormat compressedFormat;
  Vec4 color;
  float alpha;
  float blue;
  float green;
  float red;
  int texelNdx;
  TextureFormatInfo info;
  PixelBufferAccess access;
  TextureFormat format;
  deUint8 *buffer_local;
  int texelCount_local;
  int texelBlockSize_local;
  deUint32 glFormat_local;
  Random *rng_local;
  
  bVar1 = isFloatFormat(glFormat);
  if (bVar1) {
    access.super_ConstPixelBufferAccess.m_data = (void *)glu::mapGLInternalFormat(glFormat);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)(info.lookupBias.m_data + 2),
               (TextureFormat *)&access.super_ConstPixelBufferAccess.m_data,texelCount,1,1,buffer);
    tcu::getTextureFormatInfo
              ((TextureFormatInfo *)&red,
               (TextureFormat *)&access.super_ConstPixelBufferAccess.m_data);
    for (green = 0.0; (int)green < texelCount; green = (float)((int)green + 1)) {
      fVar4 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&red);
      fVar5 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(info.valueMin.m_data + 2));
      fVar4 = de::Random::getFloat(rng,fVar4,fVar5);
      fVar5 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&red);
      fVar6 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(info.valueMin.m_data + 2));
      fVar5 = de::Random::getFloat(rng,fVar5,fVar6);
      fVar6 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&red);
      fVar7 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(info.valueMin.m_data + 2));
      color.m_data[3] = de::Random::getFloat(rng,fVar6,fVar7);
      fVar6 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&red);
      fVar7 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(info.valueMin.m_data + 2));
      color.m_data[2] = de::Random::getFloat(rng,fVar6,fVar7);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&BLOCK_SIZE,fVar4,fVar5,color.m_data[3],color.m_data[2]);
      tcu::PixelBufferAccess::setPixel
                ((PixelBufferAccess *)(info.lookupBias.m_data + 2),(Vec4 *)&BLOCK_SIZE,(int)green,0,
                 0);
    }
  }
  else {
    bVar1 = glu::isCompressedFormat(glFormat);
    if (bVar1) {
      format_00 = glu::mapGLCompressedTexFormat(glFormat);
      bVar1 = tcu::isAstcFormat(format_00);
      if (bVar1) {
        blocks[7][0xc] = '\x10';
        blocks[7][0xd] = '\0';
        blocks[7][0xe] = '\0';
        blocks[7][0xf] = '\0';
        memcpy(&blockNdx,&DAT_02c42df0,0x80);
        for (i_1 = 0; i_1 < texelCount; i_1 = i_1 + 1) {
          iVar3 = de::Random::getInt(rng,0,7);
          ::deMemcpy(buffer + (i_1 << 4),&blockNdx + (long)iVar3 * 4,0x10);
        }
      }
      else {
        for (i_2 = 0; i_2 < texelBlockSize * texelCount; i_2 = i_2 + 1) {
          dVar2 = de::Random::getUint8(rng);
          buffer[i_2] = dVar2;
        }
      }
    }
    else {
      for (local_15c = 0; local_15c < texelBlockSize * texelCount; local_15c = local_15c + 1) {
        dVar2 = de::Random::getUint8(rng);
        buffer[local_15c] = dVar2;
      }
    }
  }
  return;
}

Assistant:

void genTexel (de::Random& rng, deUint32 glFormat, int texelBlockSize, const int texelCount, deUint8* buffer)
{
	if (isFloatFormat(glFormat))
	{
		const tcu::TextureFormat		format	= glu::mapGLInternalFormat(glFormat);
		const tcu::PixelBufferAccess	access	(format, texelCount, 1, 1, buffer);
		const tcu::TextureFormatInfo	info	= tcu::getTextureFormatInfo(format);

		for (int texelNdx = 0; texelNdx < texelCount; texelNdx++)
		{
			const float	red		= rng.getFloat(info.valueMin.x(), info.valueMax.x());
			const float green	= rng.getFloat(info.valueMin.y(), info.valueMax.y());
			const float blue	= rng.getFloat(info.valueMin.z(), info.valueMax.z());
			const float alpha	= rng.getFloat(info.valueMin.w(), info.valueMax.w());

			const Vec4	color	(red, green, blue, alpha);

			access.setPixel(color, texelNdx, 0, 0);
		}
	}
	else if (glu::isCompressedFormat(glFormat))
	{
		const tcu::CompressedTexFormat compressedFormat = glu::mapGLCompressedTexFormat(glFormat);

		if (tcu::isAstcFormat(compressedFormat))
		{
			const int		BLOCK_SIZE				= 16;
			const deUint8	blocks[][BLOCK_SIZE]	=
			{
				// \note All of the following blocks are valid in LDR mode.
				{ 252,	253,	255,	255,	255,	255,	255,	255,	8,		71,		90,		78,		22,		17,		26,		66,		},
				{ 252,	253,	255,	255,	255,	255,	255,	255,	220,	74,		139,	235,	249,	6,		145,	125		},
				{ 252,	253,	255,	255,	255,	255,	255,	255,	223,	251,	28,		206,	54,		251,	160,	174		},
				{ 252,	253,	255,	255,	255,	255,	255,	255,	39,		4,		153,	219,	180,	61,		51,		37		},
				{ 67,	2,		0,		254,	1,		0,		64,		215,	83,		211,	159,	105,	41,		140,	50,		2		},
				{ 67,	130,	0,		170,	84,		255,	65,		215,	83,		211,	159,	105,	41,		140,	50,		2		},
				{ 67,	2,		129,	38,		51,		229,	95,		215,	83,		211,	159,	105,	41,		140,	50,		2		},
				{ 67,	130,	193,	56,		213,	144,	95,		215,	83,		211,	159,	105,	41,		140,	50,		2		}
			};

			DE_ASSERT(texelBlockSize == BLOCK_SIZE);

			for (int i = 0; i < texelCount; i++)
			{
				const int blockNdx = rng.getInt(0, DE_LENGTH_OF_ARRAY(blocks)-1);

				deMemcpy(buffer + i * BLOCK_SIZE,  blocks[blockNdx], BLOCK_SIZE);
			}
		}
		else
		{
			for (int i = 0; i < texelBlockSize * texelCount; i++)
			{
				const deUint8 val = rng.getUint8();

				buffer[i] = val;
			}
		}
	}
	else
	{
		for (int i = 0; i < texelBlockSize * texelCount; i++)
		{
			const deUint8 val = rng.getUint8();

			buffer[i] = val;
		}
	}
}